

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

void run_schnorrsig_tests(void)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint32_t uVar8;
  int iVar9;
  uint32_t uVar10;
  uint uVar11;
  secp256k1_context *extraout_RAX;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *extraout_RAX_03;
  secp256k1_context *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *extraout_RAX_06;
  secp256k1_context *extraout_RAX_07;
  secp256k1_context *extraout_RAX_08;
  secp256k1_context *extraout_RAX_09;
  secp256k1_context *extraout_RAX_10;
  secp256k1_context *extraout_RAX_11;
  secp256k1_context *extraout_RAX_12;
  secp256k1_context *psVar12;
  secp256k1_context *extraout_RAX_13;
  size_t in_RCX;
  long lVar13;
  ulong uVar14;
  secp256k1_fe *a;
  int iVar15;
  secp256k1_fe *a_00;
  ulong uVar16;
  secp256k1_context *a_01;
  ulong uVar17;
  size_t in_R8;
  uchar *puVar18;
  uchar *sig64;
  ulong uVar19;
  byte bVar20;
  secp256k1_xonly_pubkey *pubkey;
  int32_t _calls_to_callback;
  secp256k1_callback _saved_callback;
  uchar aux_rand [32];
  uchar algo [13];
  uchar nonce_z [32];
  uchar *args [5];
  uchar key [32];
  uchar pk [32];
  uchar msg [32];
  uchar nonce [32];
  secp256k1_xonly_pubkey pk_1 [3];
  secp256k1_sha256 sha;
  secp256k1_schnorrsig_extraparams invalid_extraparams;
  int local_3ec;
  _func_void_char_ptr_void_ptr *local_3e8;
  void *pvStack_3e0;
  secp256k1_schnorrsig_extraparams local_3d8;
  undefined8 uStack_3c0;
  secp256k1_schnorrsig_extraparams local_3b8;
  secp256k1_xonly_pubkey local_398;
  undefined1 local_358 [8];
  uchar *puStack_350;
  uchar *local_348;
  secp256k1_schnorrsig_extraparams *psStack_340;
  secp256k1_schnorrsig_extraparams *local_338;
  undefined8 uStack_330;
  uchar local_328 [48];
  undefined1 local_2f8 [64];
  secp256k1_fe local_2b8;
  secp256k1_keypair local_288;
  undefined1 local_228 [96];
  uint64_t local_1c8;
  secp256k1_xonly_pubkey local_1a8;
  undefined1 local_168 [192];
  secp256k1_keypair local_a8;
  secp256k1_schnorrsig_extraparams local_48;
  
  local_3b8.noncefp._0_5_ = 0x65636e6f6e;
  builtin_memcpy(local_3b8.magic,"BIP0",4);
  local_3b8._4_4_ = 0x2f303433;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_168,"BIP0340/nonce",0xd);
  local_228._0_8_ = 0xf4bfbff746615b35;
  local_228._8_8_ = 0x83627ab39f8dc671;
  local_228._16_8_ = 0x5735866160217180;
  local_228._24_8_ = 0x68b07b4c21a29e54;
  local_1c8 = 0x40;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  secp256k1_sha256_initialize_tagged
            ((secp256k1_sha256 *)local_168,"BIP0340/auxBIP0340/nonceBIP0340/challenge",0xb);
  local_228._0_8_ = 0x4eba7e7024dd3219;
  local_228._8_8_ = 0xfa3166dca0fabb9;
  local_228._16_8_ = 0x4c44df973afbe4b1;
  local_228._24_8_ = 0x249e850a4aac2739;
  local_1c8 = 0x40;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  testrand256((uchar *)&local_2b8);
  testrand256(local_2f8);
  puVar18 = local_2f8 + 0x20;
  testrand256(puVar18);
  testrand256(local_3d8.magic);
  local_358 = (undefined1  [8])&local_2b8;
  puStack_350 = local_2f8;
  local_348 = puVar18;
  psStack_340 = &local_3b8;
  local_338 = &local_3d8;
  if (0 < COUNT) {
    iVar15 = 0;
    do {
      nonce_function_bip340_bitflip((uchar **)local_358,0,0x20,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,1,0x20,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,2,0x20,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,3,0xd,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,3,0xd,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,4,0x20,in_RCX,in_R8);
      iVar15 = iVar15 + 1;
    } while (iVar15 < COUNT);
  }
  iVar15 = nonce_function_bip340
                     (local_288.data,(uchar *)&local_2b8,0x20,local_2f8,local_2f8 + 0x20,
                      local_3b8.magic,0xd,(void *)0x0);
  if (iVar15 == 0) goto LAB_0013fe39;
  testrand_bytes_test(local_3b8.magic,0xd);
  iVar15 = nonce_function_bip340
                     (local_288.data,(uchar *)&local_2b8,0x20,local_2f8,local_2f8 + 0x20,
                      local_3b8.magic,0xd,(void *)0x0);
  if (iVar15 == 0) goto LAB_0013fe3e;
  if (0 < COUNT) {
    iVar15 = 0;
    do {
      uVar8 = testrand_int(0x1f);
      iVar9 = nonce_function_bip340
                        (local_398.data,(uchar *)&local_2b8,(ulong)(uVar8 & 0x1f),local_2f8,
                         local_2f8 + 0x20,local_3b8.magic,0xd,(void *)0x0);
      if (iVar9 == 0) goto LAB_0013fd7b;
      lVar13 = 0;
      do {
        iVar9 = (uint)local_288.data[lVar13] - (uint)local_398.data[lVar13];
        if (local_288.data[lVar13] != local_398.data[lVar13]) goto LAB_0013d956;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x20);
      iVar9 = 0;
LAB_0013d956:
      if (iVar9 == 0) goto LAB_0013fd80;
      uVar8 = testrand_int(0xc);
      iVar9 = nonce_function_bip340
                        (local_398.data,(uchar *)&local_2b8,0x20,local_2f8,local_2f8 + 0x20,
                         local_3b8.magic,((ulong)uVar8 + 0xd) % 0xd,(void *)0x0);
      if (iVar9 == 0) goto LAB_0013fd85;
      lVar13 = 0;
      do {
        iVar9 = (uint)local_288.data[lVar13] - (uint)local_398.data[lVar13];
        if (local_288.data[lVar13] != local_398.data[lVar13]) goto LAB_0013d9df;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x20);
      iVar9 = 0;
LAB_0013d9df:
      if (iVar9 == 0) goto LAB_0013fd8a;
      iVar15 = iVar15 + 1;
    } while (iVar15 < COUNT);
  }
  local_3d8.ndata = (undefined1 *)0x0;
  uStack_3c0 = 0;
  local_3d8.magic[0] = '\0';
  local_3d8.magic[1] = '\0';
  local_3d8.magic[2] = '\0';
  local_3d8.magic[3] = '\0';
  local_3d8._4_4_ = 0;
  local_3d8.noncefp = (secp256k1_nonce_function_hardened)0x0;
  iVar15 = nonce_function_bip340
                     (local_398.data,(uchar *)&local_2b8,0x20,local_2f8,local_2f8 + 0x20,
                      local_3b8.magic,0xd,&local_3d8);
  if (iVar15 == 0) goto LAB_0013fe43;
  iVar15 = nonce_function_bip340
                     (local_288.data,(uchar *)&local_2b8,0x20,local_2f8,local_2f8 + 0x20,
                      local_3b8.magic,0xd,(void *)0x0);
  if (iVar15 == 0) goto LAB_0013fe48;
  lVar13 = 0;
  do {
    iVar15 = (uint)local_398.data[lVar13] - (uint)local_288.data[lVar13];
    if (local_398.data[lVar13] != local_288.data[lVar13]) goto LAB_0013dab8;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x20);
  iVar15 = 0;
LAB_0013dab8:
  if (iVar15 != 0) goto LAB_0013fe4d;
  local_328[0x20] = '\0';
  local_328[0x21] = '\0';
  local_328[0x22] = '\0';
  local_328[0x23] = '\0';
  local_328[0x24] = '\0';
  local_328[0x25] = '\0';
  local_328[0x26] = '\0';
  local_328[0x27] = '\0';
  local_328[0x28] = '\0';
  local_328[0x29] = '\0';
  local_328[0x2a] = '\0';
  local_328[0x2b] = '\0';
  local_328[0x2c] = '\0';
  local_328[0x2d] = '\0';
  local_328[0x2e] = '\0';
  local_328[0x2f] = '\0';
  local_328[0x10] = '\0';
  local_328[0x11] = '\0';
  local_328[0x12] = '\0';
  local_328[0x13] = '\0';
  local_328[0x14] = '\0';
  local_328[0x15] = '\0';
  local_328[0x16] = '\0';
  local_328[0x17] = '\0';
  local_328[0x18] = '\0';
  local_328[0x19] = '\0';
  local_328[0x1a] = '\0';
  local_328[0x1b] = '\0';
  local_328[0x1c] = '\0';
  local_328[0x1d] = '\0';
  local_328[0x1e] = '\0';
  local_328[0x1f] = '\0';
  local_328[0] = '\0';
  local_328[1] = '\0';
  local_328[2] = '\0';
  local_328[3] = '\0';
  local_328[4] = '\0';
  local_328[5] = '\0';
  local_328[6] = '\0';
  local_328[7] = '\0';
  local_328[8] = '\0';
  local_328[9] = '\0';
  local_328[10] = '\0';
  local_328[0xb] = '\0';
  local_328[0xc] = '\0';
  local_328[0xd] = '\0';
  local_328[0xe] = '\0';
  local_328[0xf] = '\0';
  local_338 = (secp256k1_schnorrsig_extraparams *)0x0;
  uStack_330._0_4_ = 0;
  uStack_330._4_4_ = 0;
  local_348 = (uchar *)0x0;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x0;
  local_358 = (undefined1  [8])0x0;
  puStack_350 = (uchar *)0x0;
  local_3b8.ndata = (void *)0x0;
  local_3b8.magic[0] = 0xda;
  local_3b8.magic[1] = 'o';
  local_3b8.magic[2] = 0xb3;
  local_3b8.magic[3] = 0x8c;
  local_3b8._4_4_ = 0;
  local_3b8.noncefp._0_5_ = 0;
  local_3b8.noncefp._5_3_ = 0;
  local_48.magic[0] = '\0';
  local_48.magic[1] = '\0';
  local_48.magic[2] = '\0';
  local_48.magic[3] = '\0';
  local_48._4_4_ = 0;
  local_48.noncefp = (secp256k1_nonce_function_hardened)0x0;
  local_48.ndata = (void *)0x0;
  testrand256((uchar *)&local_2b8);
  testrand256(local_2f8);
  testrand256(local_2f8 + 0x20);
  testrand256(local_3d8.magic);
  iVar15 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,(uchar *)&local_2b8);
  if (iVar15 == 0) goto LAB_0013fe52;
  iVar15 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)(local_168 + 0x60),local_2f8);
  if (iVar15 == 0) goto LAB_0013fe57;
  iVar15 = secp256k1_keypair_create(CTX,&local_a8,local_2f8 + 0x20);
  if (iVar15 == 0) goto LAB_0013fe5c;
  iVar15 = secp256k1_keypair_xonly_pub
                     (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                      (secp256k1_keypair *)local_168);
  if (iVar15 == 0) goto LAB_0013fe61;
  iVar15 = secp256k1_keypair_xonly_pub
                     (CTX,(secp256k1_xonly_pubkey *)(local_228 + 0x40),(int *)0x0,
                      (secp256k1_keypair *)(local_168 + 0x60));
  if (iVar15 == 0) goto LAB_0013fe66;
  iVar15 = secp256k1_keypair_xonly_pub(CTX,&local_1a8,(int *)0x0,&local_a8);
  if (iVar15 == 0) goto LAB_0013fe6b;
  local_288.data[0x30] = '\0';
  local_288.data[0x31] = '\0';
  local_288.data[0x32] = '\0';
  local_288.data[0x33] = '\0';
  local_288.data[0x34] = '\0';
  local_288.data[0x35] = '\0';
  local_288.data[0x36] = '\0';
  local_288.data[0x37] = '\0';
  local_288.data[0x38] = '\0';
  local_288.data[0x39] = '\0';
  local_288.data[0x3a] = '\0';
  local_288.data[0x3b] = '\0';
  local_288.data[0x3c] = '\0';
  local_288.data[0x3d] = '\0';
  local_288.data[0x3e] = '\0';
  local_288.data[0x3f] = '\0';
  local_288.data[0x20] = '\0';
  local_288.data[0x21] = '\0';
  local_288.data[0x22] = '\0';
  local_288.data[0x23] = '\0';
  local_288.data[0x24] = '\0';
  local_288.data[0x25] = '\0';
  local_288.data[0x26] = '\0';
  local_288.data[0x27] = '\0';
  local_288.data._40_8_ = 0;
  local_288.data[0x10] = '\0';
  local_288.data[0x11] = '\0';
  local_288.data[0x12] = '\0';
  local_288.data[0x13] = '\0';
  local_288.data[0x14] = '\0';
  local_288.data[0x15] = '\0';
  local_288.data[0x16] = '\0';
  local_288.data[0x17] = '\0';
  local_288.data[0x18] = '\0';
  local_288.data[0x19] = '\0';
  local_288.data[0x1a] = '\0';
  local_288.data[0x1b] = '\0';
  local_288.data[0x1c] = '\0';
  local_288.data[0x1d] = '\0';
  local_288.data[0x1e] = '\0';
  local_288.data[0x1f] = '\0';
  local_288.data[0] = '\0';
  local_288.data[1] = '\0';
  local_288.data[2] = '\0';
  local_288.data[3] = '\0';
  local_288.data[4] = '\0';
  local_288.data[5] = '\0';
  local_288.data[6] = '\0';
  local_288.data[7] = '\0';
  local_288.data[8] = '\0';
  local_288.data[9] = '\0';
  local_288.data[10] = '\0';
  local_288.data[0xb] = '\0';
  local_288.data[0xc] = '\0';
  local_288.data[0xd] = '\0';
  local_288.data[0xe] = '\0';
  local_288.data[0xf] = '\0';
  iVar15 = secp256k1_schnorrsig_sign_internal
                     (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                      nonce_function_bip340,(void *)0x0);
  psVar12 = CTX;
  if (iVar15 == 0) goto LAB_0013fe70;
  local_3ec = 0;
  local_3e8 = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  if (secp256k1_context_static == CTX) goto LAB_0013fe75;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar12->illegal_callback).data = &local_3ec;
  do {
    iVar15 = secp256k1_schnorrsig_sign_internal
                       (CTX,(uchar *)0x0,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                        nonce_function_bip340,(void *)0x0);
    psVar12 = CTX;
    if (iVar15 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar12->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013fe93;
      local_3ec = 0;
      local_3e8 = (psVar12->illegal_callback).fn;
      pvStack_3e0 = (psVar12->illegal_callback).data;
      if (secp256k1_context_static == psVar12) goto LAB_0013fe98;
      (psVar12->illegal_callback).fn = counting_callback_fn;
      (psVar12->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_2();
LAB_0013fe93:
      run_schnorrsig_tests_cold_3();
      psVar12 = extraout_RAX_00;
LAB_0013fe98:
      (*(psVar12->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
    }
    iVar15 = secp256k1_schnorrsig_sign_internal
                       (CTX,local_398.data,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                        nonce_function_bip340,(void *)0x0);
    psVar12 = CTX;
    if (iVar15 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar12->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013feb6;
      local_3ec = 0;
      local_3e8 = (psVar12->illegal_callback).fn;
      pvStack_3e0 = (psVar12->illegal_callback).data;
      if (secp256k1_context_static == psVar12) goto LAB_0013febb;
      (psVar12->illegal_callback).fn = counting_callback_fn;
      (psVar12->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_4();
LAB_0013feb6:
      run_schnorrsig_tests_cold_5();
      psVar12 = extraout_RAX_01;
LAB_0013febb:
      (*(psVar12->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
    }
    iVar15 = secp256k1_schnorrsig_sign_internal
                       (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)0x0,
                        nonce_function_bip340,(void *)0x0);
    psVar12 = CTX;
    if (iVar15 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar12->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013fed9;
      local_3ec = 0;
      local_3e8 = (psVar12->illegal_callback).fn;
      pvStack_3e0 = (psVar12->illegal_callback).data;
      if (secp256k1_context_static == psVar12) goto LAB_0013fede;
      (psVar12->illegal_callback).fn = counting_callback_fn;
      (psVar12->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_6();
LAB_0013fed9:
      run_schnorrsig_tests_cold_7();
      psVar12 = extraout_RAX_02;
LAB_0013fede:
      (*(psVar12->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
    }
    iVar15 = secp256k1_schnorrsig_sign_internal
                       (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_358,
                        nonce_function_bip340,(void *)0x0);
    psVar12 = CTX;
    if (iVar15 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar12->illegal_callback).data = pvStack_3e0;
      psVar12 = STATIC_CTX;
      if (local_3ec != 1) goto LAB_0013fefc;
      local_3ec = 0;
      local_3e8 = (STATIC_CTX->illegal_callback).fn;
      pvStack_3e0 = (STATIC_CTX->illegal_callback).data;
      if (secp256k1_context_static == STATIC_CTX) goto LAB_0013ff01;
      (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
      (psVar12->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_8();
LAB_0013fefc:
      run_schnorrsig_tests_cold_9();
      psVar12 = extraout_RAX_03;
LAB_0013ff01:
      (*(psVar12->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
    }
    iVar15 = secp256k1_schnorrsig_sign_internal
                       (STATIC_CTX,local_398.data,local_3d8.magic,0x20,
                        (secp256k1_keypair *)local_168,nonce_function_bip340,(void *)0x0);
    psVar12 = STATIC_CTX;
    if (iVar15 == 0) {
      (STATIC_CTX->illegal_callback).fn = local_3e8;
      (psVar12->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013ff1f;
      iVar15 = secp256k1_schnorrsig_sign_custom
                         (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                          &local_3b8);
      psVar12 = CTX;
      if (iVar15 == 0) goto LAB_0013ff24;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_0013ff29;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar12->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_10();
LAB_0013ff1f:
      run_schnorrsig_tests_cold_11();
LAB_0013ff24:
      run_schnorrsig_tests_cold_87();
      psVar12 = extraout_RAX_04;
LAB_0013ff29:
      (*(psVar12->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
    }
    iVar15 = secp256k1_schnorrsig_sign_custom
                       (CTX,(uchar *)0x0,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                        &local_3b8);
    psVar12 = CTX;
    if (iVar15 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar12->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013ff47;
      local_3ec = 0;
      local_3e8 = (psVar12->illegal_callback).fn;
      pvStack_3e0 = (psVar12->illegal_callback).data;
      if (secp256k1_context_static == psVar12) goto LAB_0013ff4c;
      (psVar12->illegal_callback).fn = counting_callback_fn;
      (psVar12->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_12();
LAB_0013ff47:
      run_schnorrsig_tests_cold_13();
      psVar12 = extraout_RAX_05;
LAB_0013ff4c:
      (*(psVar12->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
    }
    iVar15 = secp256k1_schnorrsig_sign_custom
                       (CTX,local_398.data,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                        &local_3b8);
    psVar12 = CTX;
    if (iVar15 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar12->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013ff6a;
      iVar15 = secp256k1_schnorrsig_sign_custom
                         (psVar12,local_398.data,(uchar *)0x0,0,(secp256k1_keypair *)local_168,
                          &local_3b8);
      psVar12 = CTX;
      if (iVar15 == 0) goto LAB_0013ff6f;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_0013ff74;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar12->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_14();
LAB_0013ff6a:
      run_schnorrsig_tests_cold_15();
LAB_0013ff6f:
      run_schnorrsig_tests_cold_86();
      psVar12 = extraout_RAX_06;
LAB_0013ff74:
      (*(psVar12->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
    }
    iVar15 = secp256k1_schnorrsig_sign_custom
                       (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)0x0,&local_3b8)
    ;
    psVar12 = CTX;
    if (iVar15 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar12->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013ff92;
      local_3ec = 0;
      local_3e8 = (psVar12->illegal_callback).fn;
      pvStack_3e0 = (psVar12->illegal_callback).data;
      if (secp256k1_context_static == psVar12) goto LAB_0013ff97;
      (psVar12->illegal_callback).fn = counting_callback_fn;
      (psVar12->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_16();
LAB_0013ff92:
      run_schnorrsig_tests_cold_17();
      psVar12 = extraout_RAX_07;
LAB_0013ff97:
      (*(psVar12->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
    }
    iVar15 = secp256k1_schnorrsig_sign_custom
                       (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_358,
                        &local_3b8);
    psVar12 = CTX;
    if (iVar15 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar12->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0013ffb5;
      iVar15 = secp256k1_schnorrsig_sign_custom
                         (psVar12,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_168
                          ,(secp256k1_schnorrsig_extraparams *)0x0);
      psVar12 = CTX;
      if (iVar15 == 0) goto LAB_0013ffba;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_0013ffbf;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar12->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_18();
LAB_0013ffb5:
      run_schnorrsig_tests_cold_19();
LAB_0013ffba:
      run_schnorrsig_tests_cold_85();
      psVar12 = extraout_RAX_08;
LAB_0013ffbf:
      (*(psVar12->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
    }
    iVar15 = secp256k1_schnorrsig_sign_custom
                       (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                        &local_48);
    psVar12 = CTX;
    if (iVar15 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar12->illegal_callback).data = pvStack_3e0;
      psVar12 = STATIC_CTX;
      if (local_3ec != 1) goto LAB_0013ffdd;
      local_3ec = 0;
      local_3e8 = (STATIC_CTX->illegal_callback).fn;
      pvStack_3e0 = (STATIC_CTX->illegal_callback).data;
      if (secp256k1_context_static == STATIC_CTX) goto LAB_0013ffe2;
      (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
      (psVar12->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_20();
LAB_0013ffdd:
      run_schnorrsig_tests_cold_21();
      psVar12 = extraout_RAX_09;
LAB_0013ffe2:
      (*(psVar12->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
    }
    iVar15 = secp256k1_schnorrsig_sign_custom
                       (STATIC_CTX,local_398.data,local_3d8.magic,0x20,
                        (secp256k1_keypair *)local_168,&local_3b8);
    psVar12 = STATIC_CTX;
    if (iVar15 == 0) {
      (STATIC_CTX->illegal_callback).fn = local_3e8;
      (psVar12->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00140000;
      iVar15 = secp256k1_schnorrsig_sign_internal
                         (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                          nonce_function_bip340,(void *)0x0);
      if (iVar15 == 0) goto LAB_00140005;
      iVar15 = secp256k1_schnorrsig_verify
                         (CTX,local_398.data,local_3d8.magic,0x20,
                          (secp256k1_xonly_pubkey *)local_228);
      psVar12 = CTX;
      if (iVar15 == 0) goto LAB_0014000a;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_0014000f;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar12->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_22();
LAB_00140000:
      run_schnorrsig_tests_cold_23();
LAB_00140005:
      run_schnorrsig_tests_cold_84();
LAB_0014000a:
      run_schnorrsig_tests_cold_83();
      psVar12 = extraout_RAX_10;
LAB_0014000f:
      (*(psVar12->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
    }
    iVar15 = secp256k1_schnorrsig_verify
                       (CTX,(uchar *)0x0,local_3d8.magic,0x20,(secp256k1_xonly_pubkey *)local_228);
    psVar12 = CTX;
    if (iVar15 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar12->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0014002d;
      local_3ec = 0;
      local_3e8 = (psVar12->illegal_callback).fn;
      pvStack_3e0 = (psVar12->illegal_callback).data;
      if (secp256k1_context_static == psVar12) goto LAB_00140032;
      (psVar12->illegal_callback).fn = counting_callback_fn;
      (psVar12->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_24();
LAB_0014002d:
      run_schnorrsig_tests_cold_25();
      psVar12 = extraout_RAX_11;
LAB_00140032:
      (*(psVar12->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
    }
    iVar15 = secp256k1_schnorrsig_verify
                       (CTX,local_398.data,(uchar *)0x0,0x20,(secp256k1_xonly_pubkey *)local_228);
    psVar12 = CTX;
    if (iVar15 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar12->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00140050;
      iVar15 = secp256k1_schnorrsig_verify
                         (psVar12,local_398.data,(uchar *)0x0,0,(secp256k1_xonly_pubkey *)local_228)
      ;
      psVar12 = CTX;
      if (iVar15 != 0) goto LAB_00140055;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_0014005a;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar12->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_26();
LAB_00140050:
      run_schnorrsig_tests_cold_27();
LAB_00140055:
      run_schnorrsig_tests_cold_28();
      psVar12 = extraout_RAX_12;
LAB_0014005a:
      (*(psVar12->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
    }
    iVar15 = secp256k1_schnorrsig_verify
                       (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_xonly_pubkey *)0x0);
    psVar12 = CTX;
    if (iVar15 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar12->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00140078;
      local_3ec = 0;
      local_3e8 = (psVar12->illegal_callback).fn;
      pvStack_3e0 = (psVar12->illegal_callback).data;
      if (secp256k1_context_static == psVar12) goto LAB_0014007d;
      (psVar12->illegal_callback).fn = counting_callback_fn;
      (psVar12->illegal_callback).data = &local_3ec;
    }
    else {
      run_schnorrsig_tests_cold_29();
LAB_00140078:
      run_schnorrsig_tests_cold_30();
      psVar12 = extraout_RAX_13;
LAB_0014007d:
      (*(psVar12->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
    }
    a_00 = (secp256k1_fe *)&local_398;
    a_01 = CTX;
    iVar15 = secp256k1_schnorrsig_verify
                       (CTX,(uchar *)a_00,local_3d8.magic,0x20,(secp256k1_xonly_pubkey *)&local_288)
    ;
    psVar12 = CTX;
    if (iVar15 != 0) {
      run_schnorrsig_tests_cold_31();
LAB_0014009b:
      run_schnorrsig_tests_cold_32();
LAB_001400a0:
      run_schnorrsig_tests_cold_33();
LAB_001400a5:
      run_schnorrsig_tests_cold_34();
      goto LAB_001400aa;
    }
    (CTX->illegal_callback).fn = local_3e8;
    (psVar12->illegal_callback).data = pvStack_3e0;
    if (local_3ec != 1) goto LAB_0014009b;
    secp256k1_sha256_initialize_tagged
              ((secp256k1_sha256 *)local_168,(uchar *)"BIP0340/challenge",0x11);
    local_228._0_8_ = 0x239253819cecba11;
    local_228._8_8_ = 0xd1627e0f11679112;
    local_228._16_8_ = 0x3cc76597c87550;
    local_228._24_8_ = 0x33e9b66a90f61164;
    local_1c8 = 0x40;
    test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
    local_228._16_8_ = 0;
    local_228._24_8_ = 0x300000000000000;
    local_228._0_8_ = 0;
    local_228._8_8_ = 0;
    local_348 = (uchar *)0xb0996f8345c831b5;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0xf936e0bc13f10186;
    local_358 = (undefined1  [8])0x10c35892018a30f9;
    puStack_350 = (uchar *)0x29529df8854f3449;
    local_288.data[0x10] = '\0';
    local_288.data[0x11] = '\0';
    local_288.data[0x12] = '\0';
    local_288.data[0x13] = '\0';
    local_288.data[0x14] = '\0';
    local_288.data[0x15] = '\0';
    local_288.data[0x16] = '\0';
    local_288.data[0x17] = '\0';
    local_288.data[0x18] = '\0';
    local_288.data[0x19] = '\0';
    local_288.data[0x1a] = '\0';
    local_288.data[0x1b] = '\0';
    local_288.data[0x1c] = '\0';
    local_288.data[0x1d] = '\0';
    local_288.data[0x1e] = '\0';
    local_288.data[0x1f] = '\0';
    local_288.data[0] = '\0';
    local_288.data[1] = '\0';
    local_288.data[2] = '\0';
    local_288.data[3] = '\0';
    local_288.data[4] = '\0';
    local_288.data[5] = '\0';
    local_288.data[6] = '\0';
    local_288.data[7] = '\0';
    local_288.data[8] = '\0';
    local_288.data[9] = '\0';
    local_288.data[10] = '\0';
    local_288.data[0xb] = '\0';
    local_288.data[0xc] = '\0';
    local_288.data[0xd] = '\0';
    local_288.data[0xe] = '\0';
    local_288.data[0xf] = '\0';
    local_398.data[0x10] = '\0';
    local_398.data[0x11] = '\0';
    local_398.data[0x12] = '\0';
    local_398.data[0x13] = '\0';
    local_398.data[0x14] = '\0';
    local_398.data[0x15] = '\0';
    local_398.data[0x16] = '\0';
    local_398.data[0x17] = '\0';
    local_398.data[0x18] = '\0';
    local_398.data[0x19] = '\0';
    local_398.data[0x1a] = '\0';
    local_398.data[0x1b] = '\0';
    local_398.data[0x1c] = '\0';
    local_398.data[0x1d] = '\0';
    local_398.data[0x1e] = '\0';
    local_398.data[0x1f] = '\0';
    local_398.data[0] = '\0';
    local_398.data[1] = '\0';
    local_398.data[2] = '\0';
    local_398.data[3] = '\0';
    local_398.data[4] = '\0';
    local_398.data[5] = '\0';
    local_398.data[6] = '\0';
    local_398.data[7] = '\0';
    local_398.data[8] = '\0';
    local_398.data[9] = '\0';
    local_398.data[10] = '\0';
    local_398.data[0xb] = '\0';
    local_398.data[0xc] = '\0';
    local_398.data[0xd] = '\0';
    local_398.data[0xe] = '\0';
    local_398.data[0xf] = '\0';
    local_168[0x30] = 0xeb;
    local_168[0x31] = 0xee;
    local_168[0x32] = 0xe8;
    local_168[0x33] = 0xfd;
    local_168[0x34] = 0xb2;
    local_168[0x35] = '\x17';
    local_168[0x36] = '/';
    local_168[0x37] = 'G';
    local_168[0x38] = '}';
    local_168[0x39] = 0xf4;
    local_168[0x3a] = 0x90;
    local_168[0x3b] = '\r';
    local_168[0x3c] = '1';
    local_168[0x3d] = '\x05';
    local_168[0x3e] = '6';
    local_168[0x3f] = 0xc0;
    local_168._32_8_ = 0x718bea854a6af625;
    local_168[0x28] = 0xe4;
    local_168[0x29] = 0x82;
    local_168[0x2a] = 0xa7;
    local_168[0x2b] = 'O';
    local_168[0x2c] = '8';
    local_168[0x2d] = '-';
    local_168[0x2e] = ',';
    local_168[0x2f] = 0xe5;
    local_168._16_8_ = 0x8b007835f1cdf4b;
    local_168._24_8_ = 0x1582ca2dcef1554c;
    local_168._0_8_ = 0x108d84801f8307e9;
    local_168._8_8_ = 0x361024401b37a569;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288.data,local_398.data,0x20,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x20,local_168,1);
    local_228._16_8_ = 0x56dab4380f16e762;
    local_228._24_8_ = 0xefcf905104d984a7;
    local_228._0_8_ = 0x6a2aed8a6251e1b7;
    local_228._8_8_ = 0xc7f3f49c805871bf;
    local_348 = (uchar *)0xd8cedea21daefe58;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x59a62b507b0f2443;
    local_358 = (undefined1  [8])0x5f1c672a7fd7f1df;
    puStack_350 = (uchar *)0xbe4123db26371836;
    local_288.data[0x10] = '\0';
    local_288.data[0x11] = '\0';
    local_288.data[0x12] = '\0';
    local_288.data[0x13] = '\0';
    local_288.data[0x14] = '\0';
    local_288.data[0x15] = '\0';
    local_288.data[0x16] = '\0';
    local_288.data[0x17] = '\0';
    local_288.data[0x18] = '\0';
    local_288.data[0x19] = '\0';
    local_288.data[0x1a] = '\0';
    local_288.data[0x1b] = '\0';
    local_288.data[0x1c] = '\0';
    local_288.data[0x1d] = '\0';
    local_288.data[0x1e] = '\0';
    local_288.data[0x1f] = '\x01';
    local_288.data[0] = '\0';
    local_288.data[1] = '\0';
    local_288.data[2] = '\0';
    local_288.data[3] = '\0';
    local_288.data[4] = '\0';
    local_288.data[5] = '\0';
    local_288.data[6] = '\0';
    local_288.data[7] = '\0';
    local_288.data[8] = '\0';
    local_288.data[9] = '\0';
    local_288.data[10] = '\0';
    local_288.data[0xb] = '\0';
    local_288.data[0xc] = '\0';
    local_288.data[0xd] = '\0';
    local_288.data[0xe] = '\0';
    local_288.data[0xf] = '\0';
    local_398.data[0x10] = 0xa4;
    local_398.data[0x11] = '\t';
    local_398.data[0x12] = '8';
    local_398.data[0x13] = '\"';
    local_398.data[0x14] = ')';
    local_398.data[0x15] = 0x9f;
    local_398.data[0x16] = '1';
    local_398.data[0x17] = 0xd0;
    local_398.data[0x18] = '\b';
    local_398.data[0x19] = '.';
    local_398.data[0x1a] = 0xfa;
    local_398.data[0x1b] = 0x98;
    local_398.data[0x1c] = 0xec;
    local_398.data[0x1d] = 'N';
    local_398.data[0x1e] = 'l';
    local_398.data[0x1f] = 0x89;
    local_398.data[0] = '$';
    local_398.data[1] = '?';
    local_398.data[2] = 'j';
    local_398.data[3] = 0x88;
    local_398.data[4] = 0x85;
    local_398.data[5] = 0xa3;
    local_398.data[6] = '\b';
    local_398.data[7] = 0xd3;
    local_398.data[8] = '\x13';
    local_398.data[9] = '\x19';
    local_398.data[10] = 0x8a;
    local_398.data[0xb] = '.';
    local_398.data[0xc] = '\x03';
    local_398.data[0xd] = 'p';
    local_398.data[0xe] = 's';
    local_398.data[0xf] = 'D';
    local_168[0x30] = 0x89;
    local_168[0x31] = '~';
    local_168[0x32] = 0xfc;
    local_168[0x33] = 0xb6;
    local_168[0x34] = '9';
    local_168[0x35] = 0xea;
    local_168[0x36] = 0x87;
    local_168[0x37] = '\x1c';
    local_168[0x38] = 0xfa;
    local_168[0x39] = 0x95;
    local_168[0x3a] = 0xf6;
    local_168[0x3b] = 0xde;
    local_168[0x3c] = '3';
    local_168[0x3d] = 0x9e;
    local_168[0x3e] = 'K';
    local_168[0x3f] = '\n';
    local_168._32_8_ = 0xccab76c91ad10689;
    local_168[0x28] = 0xb2;
    local_168[0x29] = '\v';
    local_168[0x2a] = '\t';
    local_168[0x2b] = '\x12';
    local_168[0x2c] = 0x92;
    local_168[0x2d] = 0xbf;
    local_168[0x2e] = 0xf4;
    local_168[0x2f] = 0xea;
    local_168._16_8_ = 0x17f9436d3e41de1b;
    local_168._24_8_ = 0x4133de788ccf8ddc;
    local_168._0_8_ = 0x6d29aeee60bd9668;
    local_168._8_8_ = 0x7fe1df79f228ab4;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288.data,local_398.data,0x20,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x20,local_168,1);
    local_228._16_8_ = 0x74cc678a084e0229;
    local_228._24_8_ = 0xc9e5143ba6be0b02;
    local_228._0_8_ = 0x34c26821a2da0fc9;
    local_228._8_8_ = 0xd11cdc808b62c6c4;
    local_348 = (uchar *)0xc986b00953713901;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0xb84e7769d98fe160;
    local_358 = (undefined1  [8])0x137e77c5fe8a30dd;
    puStack_350 = (uchar *)0xccb7c19c2ba71f12;
    local_288.data[0x10] = '\b';
    local_288.data[0x11] = '\x0e';
    local_288.data[0x12] = 'v';
    local_288.data[0x13] = 0xcd;
    local_288.data[0x14] = 0xc6;
    local_288.data[0x15] = 0xd1;
    local_288.data[0x16] = 'i';
    local_288.data[0x17] = ',';
    local_288.data[0x18] = 'K';
    local_288.data[0x19] = '\v';
    local_288.data[0x1a] = 'b';
    local_288.data[0x1b] = 0xd7;
    local_288.data[0x1c] = 0x98;
    local_288.data[0x1d] = 0xe6;
    local_288.data[0x1e] = 0xd9;
    local_288.data[0x1f] = '\x06';
    local_288.data[0] = 200;
    local_288.data[1] = 'z';
    local_288.data[2] = 0xa5;
    local_288.data[3] = '8';
    local_288.data[4] = '$';
    local_288.data[5] = 0xb4;
    local_288.data[6] = 0xd7;
    local_288.data[7] = 0xae;
    local_288.data[8] = '.';
    local_288.data[9] = 0xb0;
    local_288.data[10] = '5';
    local_288.data[0xb] = 0xa2;
    local_288.data[0xc] = 0xb5;
    local_288.data[0xd] = 0xbb;
    local_288.data[0xe] = 0xbc;
    local_288.data[0xf] = 0xcc;
    local_398.data[0x10] = 0xda;
    local_398.data[0x11] = 0x98;
    local_398.data[0x12] = '\x05';
    local_398.data[0x13] = 0xaa;
    local_398.data[0x14] = 0xb5;
    local_398.data[0x15] = 'l';
    local_398.data[0x16] = 'w';
    local_398.data[0x17] = '3';
    local_398.data[0x18] = '0';
    local_398.data[0x19] = '$';
    local_398.data[0x1a] = 0xb9;
    local_398.data[0x1b] = 0xd0;
    local_398.data[0x1c] = 0xa5;
    local_398.data[0x1d] = '\b';
    local_398.data[0x1e] = 0xb7;
    local_398.data[0x1f] = '\\';
    local_398.data[0] = '~';
    local_398.data[1] = '-';
    local_398.data[2] = 'X';
    local_398.data[3] = 0xd8;
    local_398.data[4] = 0xb3;
    local_398.data[5] = 0xbc;
    local_398.data[6] = 0xdf;
    local_398.data[7] = '\x1a';
    local_398.data[8] = 0xba;
    local_398.data[9] = 0xde;
    local_398.data[10] = 199;
    local_398.data[0xb] = 0x82;
    local_398.data[0xc] = 0x90;
    local_398.data[0xd] = 'T';
    local_398.data[0xe] = 0xf9;
    local_398.data[0xf] = '\r';
    local_168[0x30] = 'z';
    local_168[0x31] = 0xde;
    local_168[0x32] = 0xa9;
    local_168[0x33] = 0x8d;
    local_168[0x34] = 0x82;
    local_168[0x35] = 0xf8;
    local_168[0x36] = 'H';
    local_168[0x37] = '\x1e';
    local_168[0x38] = '\x0e';
    local_168[0x39] = '\x1e';
    local_168[0x3a] = '\x03';
    local_168[0x3b] = 'g';
    local_168[0x3c] = 'J';
    local_168[0x3d] = 'o';
    local_168[0x3e] = '?';
    local_168[0x3f] = 0xb7;
    local_168._32_8_ = 0x4a95ada5795874ab;
    local_168[0x28] = 'r';
    local_168[0x29] = 0xc4;
    local_168[0x2a] = 'Z';
    local_168[0x2b] = 0x91;
    local_168[0x2c] = 0xc3;
    local_168[0x2d] = 0xa5;
    local_168[0x2e] = '\x1d';
    local_168[0x2f] = '<';
    local_168._16_8_ = 0x8b8d72602acf9bc4;
    local_168._24_8_ = 0x1b3c31dd500f204c;
    local_168._0_8_ = 0xb74bb4d7eeaa3158;
    local_168._8_8_ = 0x94429dba94ab5e4e;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288.data,local_398.data,0x20,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x20,local_168,1);
    local_228._16_8_ = 0x54a23fcf62307712;
    local_228._24_8_ = 0x101740d28ef5449e;
    local_228._0_8_ = 0x81739377262b430b;
    local_228._8_8_ = 0xd0ec662ab05bf0ae;
    local_348 = (uchar *)0x8a461df2fb950d3a;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17f5d860c1f8331b;
    local_358 = (undefined1  [8])0x25f50551f9dfd125;
    puStack_350 = (uchar *)0xad96a928f622403c;
    local_288.data[0x10] = 0xff;
    local_288.data[0x11] = 0xff;
    local_288.data[0x12] = 0xff;
    local_288.data[0x13] = 0xff;
    local_288.data[0x14] = 0xff;
    local_288.data[0x15] = 0xff;
    local_288.data[0x16] = 0xff;
    local_288.data[0x17] = 0xff;
    local_288.data[0x18] = 0xff;
    local_288.data[0x19] = 0xff;
    local_288.data[0x1a] = 0xff;
    local_288.data[0x1b] = 0xff;
    local_288.data[0x1c] = 0xff;
    local_288.data[0x1d] = 0xff;
    local_288.data[0x1e] = 0xff;
    local_288.data[0x1f] = 0xff;
    local_288.data[0] = 0xff;
    local_288.data[1] = 0xff;
    local_288.data[2] = 0xff;
    local_288.data[3] = 0xff;
    local_288.data[4] = 0xff;
    local_288.data[5] = 0xff;
    local_288.data[6] = 0xff;
    local_288.data[7] = 0xff;
    local_288.data[8] = 0xff;
    local_288.data[9] = 0xff;
    local_288.data[10] = 0xff;
    local_288.data[0xb] = 0xff;
    local_288.data[0xc] = 0xff;
    local_288.data[0xd] = 0xff;
    local_288.data[0xe] = 0xff;
    local_288.data[0xf] = 0xff;
    local_398.data[0x10] = 0xff;
    local_398.data[0x11] = 0xff;
    local_398.data[0x12] = 0xff;
    local_398.data[0x13] = 0xff;
    local_398.data[0x14] = 0xff;
    local_398.data[0x15] = 0xff;
    local_398.data[0x16] = 0xff;
    local_398.data[0x17] = 0xff;
    local_398.data[0x18] = 0xff;
    local_398.data[0x19] = 0xff;
    local_398.data[0x1a] = 0xff;
    local_398.data[0x1b] = 0xff;
    local_398.data[0x1c] = 0xff;
    local_398.data[0x1d] = 0xff;
    local_398.data[0x1e] = 0xff;
    local_398.data[0x1f] = 0xff;
    local_398.data[0] = 0xff;
    local_398.data[1] = 0xff;
    local_398.data[2] = 0xff;
    local_398.data[3] = 0xff;
    local_398.data[4] = 0xff;
    local_398.data[5] = 0xff;
    local_398.data[6] = 0xff;
    local_398.data[7] = 0xff;
    local_398.data[8] = 0xff;
    local_398.data[9] = 0xff;
    local_398.data[10] = 0xff;
    local_398.data[0xb] = 0xff;
    local_398.data[0xc] = 0xff;
    local_398.data[0xd] = 0xff;
    local_398.data[0xe] = 0xff;
    local_398.data[0xf] = 0xff;
    local_168[0x30] = 0xf2;
    local_168[0x31] = '_';
    local_168[0x32] = 0xd7;
    local_168[0x33] = 0x88;
    local_168[0x34] = 0x81;
    local_168[0x35] = 0xeb;
    local_168[0x36] = 0xb3;
    local_168[0x37] = '\'';
    local_168[0x38] = 'q';
    local_168[0x39] = 0xfc;
    local_168[0x3a] = 'Y';
    local_168[0x3b] = '\"';
    local_168[0x3c] = 0xef;
    local_168[0x3d] = 0xc6;
    local_168[0x3e] = 'n';
    local_168[0x3f] = 0xa3;
    local_168._32_8_ = 0x93b33db19c2b5897;
    local_168[0x28] = '7';
    local_168[0x29] = '\x05';
    local_168[0x2a] = 0xb3;
    local_168[0x2b] = '+';
    local_168[0x2c] = 0xa9;
    local_168[0x2d] = 0x82;
    local_168[0x2e] = 0xaf;
    local_168[0x2f] = 'Z';
    local_168._16_8_ = 0xb651dd87a1c1ec65;
    local_168._24_8_ = 0xecd53796dc1eda4f;
    local_168._0_8_ = 0xf146e2579750b07e;
    local_168._8_8_ = 0xb91c615156884994;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288.data,local_398.data,0x20,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x20,local_168,1);
    local_228._16_8_ = 0xaae28b6d7430fa7d;
    local_228._24_8_ = 0xb9c72dd2295f9765;
    local_228._0_8_ = 0x12e499bb09359cd6;
    local_228._8_8_ = 0x83724e54e80f8be6;
    local_348 = (uchar *)0x9b591ac87578f199;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x36769b989986c56;
    local_358 = (undefined1  [8])0xb283cc8ff6c3f34d;
    puStack_350 = (uchar *)0x24a73104c9429d7e;
    local_168[0x30] = '`';
    local_168[0x31] = 0xcb;
    local_168[0x32] = 'q';
    local_168[0x33] = 0xc0;
    local_168[0x34] = 'N';
    local_168[0x35] = 0x80;
    local_168[0x36] = 0xf5;
    local_168[0x37] = 0x93;
    local_168[0x38] = '\x06';
    local_168[0x39] = '\v';
    local_168[0x3a] = '\a';
    local_168[0x3b] = 0xd2;
    local_168[0x3c] = 0x83;
    local_168[0x3d] = '\b';
    local_168[0x3e] = 0xd7;
    local_168[0x3f] = 0xf4;
    local_168._32_8_ = 0xb303f68a54b1af76;
    local_168[0x28] = 0xeb;
    local_168[0x29] = 'E';
    local_168[0x2a] = 0xc9;
    local_168[0x2b] = 0xf8;
    local_168[0x2c] = ' ';
    local_168[0x2d] = '}';
    local_168[0x2e] = 0xee;
    local_168[0x2f] = '\x10';
    local_168._16_8_ = 0x28aaf51494eda089;
    local_168._24_8_ = 0x639c5f79d6960dad;
    local_168._0_8_ = 0;
    local_168._8_8_ = 0x3f56ce783b000000;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,1);
    local_228._16_8_ = 0x8776b979ae9898eb;
    local_228._24_8_ = 0x344a2d4aa0fae466;
    local_228._0_8_ = 0x507767db4ceafdee;
    local_228._8_8_ = 0x21cfea07e8fe20a4;
    a_00 = (secp256k1_fe *)local_168;
    a_01 = CTX;
    iVar15 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)a_00,local_228);
    if (iVar15 != 0) goto LAB_001400a0;
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 'z';
    local_168[0x31] = 's';
    local_168[0x32] = 0xc6;
    local_168[0x33] = 'C';
    local_168[0x34] = 0xe1;
    local_168[0x35] = 'f';
    local_168[0x36] = 0xbe;
    local_168[0x37] = '^';
    local_168[0x38] = 0xbe;
    local_168[0x39] = 0xaf;
    local_168[0x3a] = 0xa3;
    local_168[0x3b] = 'K';
    local_168[0x3c] = '\x1a';
    local_168[0x3d] = 0xc5;
    local_168[0x3e] = 'S';
    local_168[0x3f] = 0xe2;
    local_168._32_8_ = 0x7c60a644479c23c;
    local_168[0x28] = 0xcd;
    local_168[0x29] = '\x10';
    local_168[0x2a] = 'z';
    local_168[0x2b] = 0xe1;
    local_168[0x2c] = '\t';
    local_168[0x2d] = '#';
    local_168[0x2e] = 0xd9;
    local_168[0x2f] = 0xef;
    local_168._16_8_ = 0x8ba168852f47f682;
    local_168._24_8_ = 0x56752960147a052f;
    local_168._0_8_ = 0xa4ee5e75d57bf9ff;
    local_168._8_8_ = 0xd3355235143a4520;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 'b';
    local_168[0x31] = '*';
    local_168[0x32] = 0x95;
    local_168[0x33] = 'L';
    local_168[0x34] = 0xfe;
    local_168[0x35] = 'T';
    local_168[0x36] = 'W';
    local_168[0x37] = '5';
    local_168[0x38] = 0xaa;
    local_168[0x39] = 0xea;
    local_168[0x3a] = 'Q';
    local_168[0x3b] = '4';
    local_168[0x3c] = 0xfc;
    local_168[0x3d] = 0xcd;
    local_168[0x3e] = 0xb2;
    local_168[0x3f] = 0xbd;
    local_168._32_8_ = 0x89716edb3e0b8928;
    local_168[0x28] = 0xb6;
    local_168[0x29] = '0';
    local_168[0x2a] = 'D';
    local_168[0x2b] = 0x8b;
    local_168[0x2c] = 'Q';
    local_168[0x2d] = '\\';
    local_168[0x2e] = 0xe4;
    local_168[0x2f] = 0xf8;
    local_168._16_8_ = 0xf46f3fdf13b032b4;
    local_168._24_8_ = 0x5f51e1e033cb9ff9;
    local_168._0_8_ = 0x1cc2db1e332ea61f;
    local_168._8_8_ = 0xa70011abd2924739;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 0xe8;
    local_168[0x31] = 0xd7;
    local_168[0x32] = 0xc9;
    local_168[0x33] = '>';
    local_168[0x34] = '\0';
    local_168[0x35] = 0xc5;
    local_168[0x36] = 0xed;
    local_168[0x37] = '\f';
    local_168[0x38] = '\x18';
    local_168[0x39] = '4';
    local_168[0x3a] = 0xff;
    local_168[0x3b] = '\r';
    local_168[0x3c] = '\f';
    local_168[0x3d] = '.';
    local_168[0x3e] = 'm';
    local_168[0x3f] = 0xa6;
    local_168._32_8_ = 0xfc2f9baab3641796;
    local_168[0x28] = 0xb6;
    local_168[0x29] = 0xef;
    local_168[0x2a] = 0x94;
    local_168[0x2b] = '{';
    local_168[0x2c] = 'h';
    local_168[0x2d] = 0x87;
    local_168[0x2e] = 0xa2;
    local_168[0x2f] = '&';
    local_168._16_8_ = 0x96d9b2896097c174;
    local_168._24_8_ = 0x6977173e54e5a23d;
    local_168._0_8_ = 0xea696ca83b5cff6c;
    local_168._8_8_ = 0x4fcb9b1af376734b;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 'O';
    local_168[0x31] = 0xb7;
    local_168[0x32] = '4';
    local_168[0x33] = 'v';
    local_168[0x34] = 0xf0;
    local_168[0x35] = 0xd5;
    local_168[0x36] = 0x94;
    local_168[0x37] = 0xdc;
    local_168[0x38] = 0xb6;
    local_168[0x39] = '\\';
    local_168[0x3a] = 'd';
    local_168[0x3b] = '%';
    local_168[0x3c] = 0xbd;
    local_168[0x3d] = '\x18';
    local_168[0x3e] = '`';
    local_168[0x3f] = 'Q';
    local_168._32_8_ = 0x239caf2883da3d12;
    local_168[0x28] = 0xa9;
    local_168[0x29] = 'L';
    local_168[0x2a] = '\x1f';
    local_168[0x2b] = 0xee;
    local_168[0x2c] = 0xcf;
    local_168[0x2d] = 0xd1;
    local_168[0x2e] = '#';
    local_168[0x2f] = 0xba;
    local_168._16_8_ = 0;
    local_168._24_8_ = 0;
    local_168._0_8_ = 0;
    local_168._8_8_ = 0;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 0xdb;
    local_168[0x31] = 0xa8;
    local_168[0x32] = '\x7f';
    local_168[0x33] = '\x11';
    local_168[0x34] = 0xac;
    local_168[0x35] = 'g';
    local_168[0x36] = 'T';
    local_168[0x37] = 0xf9;
    local_168[0x38] = '7';
    local_168[0x39] = 0x80;
    local_168[0x3a] = 0xd5;
    local_168[0x3b] = 0xa1;
    local_168[0x3c] = 0x83;
    local_168[0x3d] = '|';
    local_168[0x3e] = 0xf1;
    local_168[0x3f] = 0x97;
    local_168._32_8_ = 0x6488e25aaffb1576;
    local_168[0x28] = '\x01';
    local_168[0x29] = '<';
    local_168[0x2a] = '\t';
    local_168[0x2b] = 0x97;
    local_168[0x2c] = 'B';
    local_168[0x2d] = 0xde;
    local_168[0x2e] = 0xad;
    local_168[0x2f] = 0xb4;
    local_168._16_8_ = 0;
    local_168._24_8_ = 0x100000000000000;
    local_168._0_8_ = 0;
    local_168._8_8_ = 0;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 0xd1;
    local_168[0x31] = 0xd7;
    local_168[0x32] = '\x13';
    local_168[0x33] = 0xa8;
    local_168[0x34] = 0xae;
    local_168[0x35] = 0x82;
    local_168[0x36] = 0xb3;
    local_168[0x37] = '/';
    local_168[0x38] = 0xa7;
    local_168[0x39] = 0x9d;
    local_168[0x3a] = '_';
    local_168[0x3b] = '\x7f';
    local_168[0x3c] = 0xc4;
    local_168[0x3d] = '\a';
    local_168[0x3e] = 0xd3;
    local_168[0x3f] = 0x9b;
    local_168._32_8_ = 0x3d064554c9be869;
    local_168[0x28] = 'I';
    local_168[0x29] = '\x10';
    local_168[0x2a] = 'k';
    local_168[0x2b] = 0x84;
    local_168[0x2c] = 0x97;
    local_168[0x2d] = 'x';
    local_168[0x2e] = ']';
    local_168[0x2f] = 0xd7;
    local_168._16_8_ = 0xc79b260f2ba84d56;
    local_168._24_8_ = 0x1dba290422f8740a;
    local_168._0_8_ = 0x5a3957aeac8d294a;
    local_168._8_8_ = 0xcb1dfddb5d79d015;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 0xd1;
    local_168[0x31] = 0xd7;
    local_168[0x32] = '\x13';
    local_168[0x33] = 0xa8;
    local_168[0x34] = 0xae;
    local_168[0x35] = 0x82;
    local_168[0x36] = 0xb3;
    local_168[0x37] = '/';
    local_168[0x38] = 0xa7;
    local_168[0x39] = 0x9d;
    local_168[0x3a] = '_';
    local_168[0x3b] = '\x7f';
    local_168[0x3c] = 0xc4;
    local_168[0x3d] = '\a';
    local_168[0x3e] = 0xd3;
    local_168[0x3f] = 0x9b;
    local_168._32_8_ = 0x3d064554c9be869;
    local_168[0x28] = 'I';
    local_168[0x29] = '\x10';
    local_168[0x2a] = 'k';
    local_168[0x2b] = 0x84;
    local_168[0x2c] = 0x97;
    local_168[0x2d] = 'x';
    local_168[0x2e] = ']';
    local_168[0x2f] = 0xd7;
    local_168._16_8_ = 0xffffffffffffffff;
    local_168._24_8_ = 0x2ffcfffffeffffff;
    local_168._0_8_ = 0xffffffffffffffff;
    local_168._8_8_ = 0xffffffffffffffff;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = 0xbe4123db26371836;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    puStack_350 = (uchar *)0x447370032e8a1913;
    local_168[0x30] = 0xba;
    local_168[0x31] = 0xae;
    local_168[0x32] = 0xdc;
    local_168[0x33] = 0xe6;
    local_168[0x34] = 0xaf;
    local_168[0x35] = 'H';
    local_168[0x36] = 0xa0;
    local_168[0x37] = ';';
    local_168[0x38] = 0xbf;
    local_168[0x39] = 0xd2;
    local_168[0x3a] = '^';
    local_168[0x3b] = 0x8c;
    local_168[0x3c] = 0xd0;
    local_168[0x3d] = '6';
    local_168[0x3e] = 'A';
    local_168[0x3f] = 'A';
    local_168._32_8_ = 0xffffffffffffffff;
    local_168[0x28] = 0xff;
    local_168[0x29] = 0xff;
    local_168[0x2a] = 0xff;
    local_168[0x2b] = 0xff;
    local_168[0x2c] = 0xff;
    local_168[0x2d] = 0xff;
    local_168[0x2e] = 0xff;
    local_168[0x2f] = 0xfe;
    local_168._16_8_ = 0x96d9b2896097c174;
    local_168._24_8_ = 0x6977173e54e5a23d;
    local_168._0_8_ = 0xea696ca83b5cff6c;
    local_168._8_8_ = 0x4fcb9b1af376734b;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228._16_8_ = 0xffffffffffffffff;
    local_228._24_8_ = 0x30fcfffffeffffff;
    local_228._0_8_ = 0xffffffffffffffff;
    local_228._8_8_ = 0xffffffffffffffff;
    a_00 = (secp256k1_fe *)local_168;
    a_01 = CTX;
    iVar15 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)a_00,local_228);
    if (iVar15 != 0) goto LAB_001400a5;
    local_228._16_8_ = 0x4003400340034003;
    local_228._24_8_ = 0x4003400340034003;
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = 0x4003400340034003;
    local_348 = (uchar *)0x238be6f6b6faf94b;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_358 = (undefined1  [8])0xc43a39b453aa8c77;
    puStack_350 = (uchar *)0x22877a49094d7767;
    local_288.data[0x10] = '\0';
    local_288.data[0x11] = '\0';
    local_288.data[0x12] = '\0';
    local_288.data[0x13] = '\0';
    local_288.data[0x14] = '\0';
    local_288.data[0x15] = '\0';
    local_288.data[0x16] = '\0';
    local_288.data[0x17] = '\0';
    local_288.data[0x18] = '\0';
    local_288.data[0x19] = '\0';
    local_288.data[0x1a] = '\0';
    local_288.data[0x1b] = '\0';
    local_288.data[0x1c] = '\0';
    local_288.data[0x1d] = '\0';
    local_288.data[0x1e] = '\0';
    local_288.data[0x1f] = '\0';
    local_288.data[0] = '\0';
    local_288.data[1] = '\0';
    local_288.data[2] = '\0';
    local_288.data[3] = '\0';
    local_288.data[4] = '\0';
    local_288.data[5] = '\0';
    local_288.data[6] = '\0';
    local_288.data[7] = '\0';
    local_288.data[8] = '\0';
    local_288.data[9] = '\0';
    local_288.data[10] = '\0';
    local_288.data[0xb] = '\0';
    local_288.data[0xc] = '\0';
    local_288.data[0xd] = '\0';
    local_288.data[0xe] = '\0';
    local_288.data[0xf] = '\0';
    local_168[0x30] = 0x9f;
    local_168[0x31] = '-';
    local_168[0x32] = 'V';
    local_168[0x33] = '\x0f';
    local_168[0x34] = 0xac;
    local_168[0x35] = 'e';
    local_168[0x36] = '(';
    local_168[0x37] = '\'';
    local_168[0x38] = 0xd1;
    local_168[0x39] = 0xaf;
    local_168[0x3a] = '\x05';
    local_168[0x3b] = 't';
    local_168[0x3c] = 0xe4;
    local_168[0x3d] = '\'';
    local_168[0x3e] = 0xab;
    local_168[0x3f] = 'c';
    local_168._32_8_ = 0x624603bf26ce6960;
    local_168[0x28] = '(';
    local_168[0x29] = 0xf1;
    local_168[0x2a] = 0x9a;
    local_168[0x2b] = ':';
    local_168[0x2c] = 'b';
    local_168[0x2d] = 0xdb;
    local_168[0x2e] = 0x8a;
    local_168[0x2f] = 'd';
    local_168._16_8_ = 0xccfc326743adb66b;
    local_168._24_8_ = 0xcf645489551a2925;
    local_168._0_8_ = 0xfbd9ec65b15d5371;
    local_168._8_8_ = 0x1861eafa5f6e04bc;
    local_2b8.magnitude = 0;
    local_2b8.normalized = 0;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288.data,(uchar *)0x0,0,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,(uchar *)0x0,0,local_168,1);
    local_228._16_8_ = 0x4003400340034003;
    local_228._24_8_ = 0x4003400340034003;
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = 0x4003400340034003;
    local_348 = (uchar *)0x238be6f6b6faf94b;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_358 = (undefined1  [8])0xc43a39b453aa8c77;
    puStack_350 = (uchar *)0x22877a49094d7767;
    local_288.data[0x10] = '\0';
    local_288.data[0x11] = '\0';
    local_288.data[0x12] = '\0';
    local_288.data[0x13] = '\0';
    local_288.data[0x14] = '\0';
    local_288.data[0x15] = '\0';
    local_288.data[0x16] = '\0';
    local_288.data[0x17] = '\0';
    local_288.data[0x18] = '\0';
    local_288.data[0x19] = '\0';
    local_288.data[0x1a] = '\0';
    local_288.data[0x1b] = '\0';
    local_288.data[0x1c] = '\0';
    local_288.data[0x1d] = '\0';
    local_288.data[0x1e] = '\0';
    local_288.data[0x1f] = '\0';
    local_288.data[0] = '\0';
    local_288.data[1] = '\0';
    local_288.data[2] = '\0';
    local_288.data[3] = '\0';
    local_288.data[4] = '\0';
    local_288.data[5] = '\0';
    local_288.data[6] = '\0';
    local_288.data[7] = '\0';
    local_288.data[8] = '\0';
    local_288.data[9] = '\0';
    local_288.data[10] = '\0';
    local_288.data[0xb] = '\0';
    local_288.data[0xc] = '\0';
    local_288.data[0xd] = '\0';
    local_288.data[0xe] = '\0';
    local_288.data[0xf] = '\0';
    local_398.data[0] = '\x11';
    local_168[0x30] = 0xfe;
    local_168[0x31] = '|';
    local_168[0x32] = 0xac;
    local_168[0x33] = 0xfc;
    local_168[0x34] = 'Z';
    local_168[0x35] = 'W';
    local_168[0x36] = '}';
    local_168[0x37] = '3';
    local_168[0x38] = 0xec;
    local_168[0x39] = '\x14';
    local_168[0x3a] = 'V';
    local_168[0x3b] = 'L';
    local_168[0x3c] = 0xec;
    local_168[0x3d] = '+';
    local_168[0x3e] = 0xac;
    local_168[0x3f] = 0xbf;
    local_168._32_8_ = 0xbd8366eabf7331ea;
    local_168[0x28] = '\x10';
    local_168[0x29] = '\x1f';
    local_168[0x2a] = 0xa5;
    local_168[0x2b] = 0xaa;
    local_168[0x2c] = ']';
    local_168[0x2d] = 0xbc;
    local_168[0x2e] = '\x19';
    local_168[0x2f] = 0x96;
    local_168._16_8_ = 0x354c3be64a93b9b1;
    local_168._24_8_ = 0x3a3c63411aef311;
    local_168._0_8_ = 0x2441f6fe0a0aa208;
    local_168._8_8_ = 0x3a583c69e0329264;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288.data,local_398.data,1,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,1,local_168,1);
    local_228._16_8_ = 0x4003400340034003;
    local_228._24_8_ = 0x4003400340034003;
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = 0x4003400340034003;
    local_348 = (uchar *)0x238be6f6b6faf94b;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_358 = (undefined1  [8])0xc43a39b453aa8c77;
    puStack_350 = (uchar *)0x22877a49094d7767;
    local_288.data[0x10] = '\0';
    local_288.data[0x11] = '\0';
    local_288.data[0x12] = '\0';
    local_288.data[0x13] = '\0';
    local_288.data[0x14] = '\0';
    local_288.data[0x15] = '\0';
    local_288.data[0x16] = '\0';
    local_288.data[0x17] = '\0';
    local_288.data[0x18] = '\0';
    local_288.data[0x19] = '\0';
    local_288.data[0x1a] = '\0';
    local_288.data[0x1b] = '\0';
    local_288.data[0x1c] = '\0';
    local_288.data[0x1d] = '\0';
    local_288.data[0x1e] = '\0';
    local_288.data[0x1f] = '\0';
    local_288.data[0] = '\0';
    local_288.data[1] = '\0';
    local_288.data[2] = '\0';
    local_288.data[3] = '\0';
    local_288.data[4] = '\0';
    local_288.data[5] = '\0';
    local_288.data[6] = '\0';
    local_288.data[7] = '\0';
    local_288.data[8] = '\0';
    local_288.data[9] = '\0';
    local_288.data[10] = '\0';
    local_288.data[0xb] = '\0';
    local_288.data[0xc] = '\0';
    local_288.data[0xd] = '\0';
    local_288.data[0xe] = '\0';
    local_288.data[0xf] = '\0';
    builtin_memcpy(local_398.data,"\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10\x11",0x11);
    local_168[0x30] = 0xe1;
    local_168[0x31] = 0xe5;
    local_168[0x32] = 0xa3;
    local_168[0x33] = '\x7f';
    local_168[0x34] = 0xd8;
    local_168[0x35] = '\x0e';
    local_168[0x36] = 'Z';
    local_168[0x37] = 'Q';
    local_168[0x38] = 0x89;
    local_168[0x39] = '|';
    local_168[0x3a] = 'U';
    local_168[0x3b] = 'f';
    local_168[0x3c] = 0xa9;
    local_168[0x3d] = '~';
    local_168[0x3e] = 0xa5;
    local_168[0x3f] = 0xa5;
    local_168._32_8_ = 0xf860f97bb782a4c4;
    local_168[0x28] = 'h';
    local_168[0x29] = '\x15';
    local_168[0x2a] = '@';
    local_168[0x2b] = 0xe2;
    local_168[0x2c] = '[';
    local_168[0x2d] = 'g';
    local_168[0x2e] = 'q';
    local_168[0x2f] = 0xec;
    local_168._16_8_ = 0x523c1ea7d199865d;
    local_168._24_8_ = 0x70c30ab5b6fd9ada;
    local_168._0_8_ = 0x3bb459409af33051;
    local_168._8_8_ = 0x2be5ec199ac0cac7;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288.data,local_398.data,0x11,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x11,local_168,1);
    local_348 = (uchar *)0x4003400340034003;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
    local_358 = (undefined1  [8])0x4003400340034003;
    puStack_350 = (uchar *)0x4003400340034003;
    local_288.data[0x10] = 'K';
    local_288.data[0x11] = 0xf9;
    local_288.data[0x12] = 0xfa;
    local_288.data[0x13] = 0xb6;
    local_288.data[0x14] = 0xf6;
    local_288.data[0x15] = 0xe6;
    local_288.data[0x16] = 0x8b;
    local_288.data[0x17] = '#';
    local_288.data[0x18] = '\b';
    local_288.data[0x19] = 'd';
    local_288.data[0x1a] = 0x97;
    local_288.data[0x1b] = '2';
    local_288.data[0x1c] = 'M';
    local_288.data[0x1d] = 'o';
    local_288.data[0x1e] = 0xd1;
    local_288.data[0x1f] = '\x17';
    local_288.data[0] = 'w';
    local_288.data[1] = 0x8c;
    local_288.data[2] = 0xaa;
    local_288.data[3] = 'S';
    local_288.data[4] = 0xb4;
    local_288.data[5] = '9';
    local_288.data[6] = ':';
    local_288.data[7] = 0xc4;
    local_288.data[8] = 'g';
    local_288.data[9] = 'w';
    local_288.data[10] = 'M';
    local_288.data[0xb] = '\t';
    local_288.data[0xc] = 'I';
    local_288.data[0xd] = 'z';
    local_288.data[0xe] = 0x87;
    local_288.data[0xf] = '\"';
    local_398.data[0x10] = '\0';
    local_398.data[0x11] = '\0';
    local_398.data[0x12] = '\0';
    local_398.data[0x13] = '\0';
    local_398.data[0x14] = '\0';
    local_398.data[0x15] = '\0';
    local_398.data[0x16] = '\0';
    local_398.data[0x17] = '\0';
    local_398.data[0x18] = '\0';
    local_398.data[0x19] = '\0';
    local_398.data[0x1a] = '\0';
    local_398.data[0x1b] = '\0';
    local_398.data[0x1c] = '\0';
    local_398.data[0x1d] = '\0';
    local_398.data[0x1e] = '\0';
    local_398.data[0x1f] = '\0';
    local_398.data[0] = '\0';
    local_398.data[1] = '\0';
    local_398.data[2] = '\0';
    local_398.data[3] = '\0';
    local_398.data[4] = '\0';
    local_398.data[5] = '\0';
    local_398.data[6] = '\0';
    local_398.data[7] = '\0';
    local_398.data[8] = '\0';
    local_398.data[9] = '\0';
    local_398.data[10] = '\0';
    local_398.data[0xb] = '\0';
    local_398.data[0xc] = '\0';
    local_398.data[0xd] = '\0';
    local_398.data[0xe] = '\0';
    local_398.data[0xf] = '\0';
    local_228[0x30] = 0x89;
    local_228[0x31] = '\x7f';
    local_228[0x32] = 0xcb;
    local_228[0x33] = 0xa0;
    local_228[0x34] = 0xe9;
    local_228[0x35] = 0xd0;
    local_228[0x36] = 0xb4;
    local_228[0x37] = 0xa0;
    local_228[0x38] = 'h';
    local_228[0x39] = 0x94;
    local_228[0x3a] = 0xcf;
    local_228[0x3b] = 0xd2;
    local_228[0x3c] = 'I';
    local_228[0x3d] = 0xf2;
    local_228[0x3e] = '#';
    local_228[0x3f] = 'g';
    local_228._32_8_ = 0xe7070817e3d35e58;
    local_228[0x28] = 0xc0;
    local_228[0x29] = ';';
    local_228[0x2a] = 'r';
    local_228[0x2b] = '\x0f';
    local_228[0x2c] = 0xc5;
    local_228[0x2d] = 'L';
    local_228[0x2e] = '{';
    local_228[0x2f] = '#';
    local_228._16_8_ = 0x6fbea8bf5d1e3203;
    local_228._24_8_ = 0xa879ca3e16351609;
    local_228._0_8_ = 0x345a55d8b0123b40;
    local_228._8_8_ = 0x635646c77eea7541;
    local_168[0x50] = 0x99;
    local_168[0x51] = 0x99;
    local_168[0x52] = 0x99;
    local_168[0x53] = 0x99;
    local_168[0x54] = 0x99;
    local_168[0x55] = 0x99;
    local_168[0x56] = 0x99;
    local_168[0x57] = 0x99;
    local_168[0x58] = 0x99;
    local_168[0x59] = 0x99;
    local_168[0x5a] = 0x99;
    local_168[0x5b] = 0x99;
    local_168[0x5c] = 0x99;
    local_168[0x5d] = 0x99;
    local_168[0x5e] = 0x99;
    local_168[0x5f] = 0x99;
    local_168[0x40] = 0x99;
    local_168[0x41] = 0x99;
    local_168[0x42] = 0x99;
    local_168[0x43] = 0x99;
    local_168[0x44] = 0x99;
    local_168[0x45] = 0x99;
    local_168[0x46] = 0x99;
    local_168[0x47] = 0x99;
    local_168[0x48] = 0x99;
    local_168[0x49] = 0x99;
    local_168[0x4a] = 0x99;
    local_168[0x4b] = 0x99;
    local_168[0x4c] = 0x99;
    local_168[0x4d] = 0x99;
    local_168[0x4e] = 0x99;
    local_168[0x4f] = 0x99;
    local_168[0x30] = 0x99;
    local_168[0x31] = 0x99;
    local_168[0x32] = 0x99;
    local_168[0x33] = 0x99;
    local_168[0x34] = 0x99;
    local_168[0x35] = 0x99;
    local_168[0x36] = 0x99;
    local_168[0x37] = 0x99;
    local_168[0x38] = 0x99;
    local_168[0x39] = 0x99;
    local_168[0x3a] = 0x99;
    local_168[0x3b] = 0x99;
    local_168[0x3c] = 0x99;
    local_168[0x3d] = 0x99;
    local_168[0x3e] = 0x99;
    local_168[0x3f] = 0x99;
    local_168._32_8_ = 0x9999999999999999;
    local_168[0x28] = 0x99;
    local_168[0x29] = 0x99;
    local_168[0x2a] = 0x99;
    local_168[0x2b] = 0x99;
    local_168[0x2c] = 0x99;
    local_168[0x2d] = 0x99;
    local_168[0x2e] = 0x99;
    local_168[0x2f] = 0x99;
    local_168._16_8_ = 0x9999999999999999;
    local_168._24_8_ = 0x9999999999999999;
    local_168._0_8_ = 0x9999999999999999;
    local_168._8_8_ = 0x9999999999999999;
    local_168._96_4_ = 0x99999999;
    test_schnorrsig_bip_vectors_check_signing
              (local_358,local_288.data,local_398.data,local_168,100,local_228);
    test_schnorrsig_bip_vectors_check_verify(local_288.data,local_168,100,local_228,1);
    if (COUNT < 1) break;
    while( true ) {
      pubkey = (secp256k1_xonly_pubkey *)local_228;
      local_2f8._16_8_ = 0x6e68637320612072;
      local_2f8._24_8_ = 0x2e2e67697372726f;
      local_2f8._0_8_ = 0x2073692073696874;
      local_2f8._8_8_ = 0x6f662067736d2061;
      local_398.data[0x30] = '\0';
      local_398.data[0x31] = '\0';
      local_398.data[0x32] = '\0';
      local_398.data[0x33] = '\0';
      local_398.data[0x34] = '\0';
      local_398.data[0x35] = '\0';
      local_398.data[0x36] = '\0';
      local_398.data[0x37] = '\0';
      local_398.data[0x38] = '\0';
      local_398.data[0x39] = '\0';
      local_398.data[0x3a] = '\0';
      local_398.data[0x3b] = '\0';
      local_398.data[0x3c] = '\0';
      local_398.data[0x3d] = '\0';
      local_398.data[0x3e] = '\0';
      local_398.data[0x3f] = '\0';
      local_398.data[0x20] = '\0';
      local_398.data[0x21] = '\0';
      local_398.data[0x22] = '\0';
      local_398.data[0x23] = '\0';
      local_398.data[0x24] = '\0';
      local_398.data[0x25] = '\0';
      local_398.data[0x26] = '\0';
      local_398.data[0x27] = '\0';
      local_398.data._40_8_ = 0;
      local_398.data[0x10] = '\0';
      local_398.data[0x11] = '\0';
      local_398.data[0x12] = '\0';
      local_398.data[0x13] = '\0';
      local_398.data[0x14] = '\0';
      local_398.data[0x15] = '\0';
      local_398.data[0x16] = '\0';
      local_398.data[0x17] = '\0';
      local_398.data[0x18] = '\0';
      local_398.data[0x19] = '\0';
      local_398.data[0x1a] = '\0';
      local_398.data[0x1b] = '\0';
      local_398.data[0x1c] = '\0';
      local_398.data[0x1d] = '\0';
      local_398.data[0x1e] = '\0';
      local_398.data[0x1f] = '\0';
      local_398.data[0] = '\0';
      local_398.data[1] = '\0';
      local_398.data[2] = '\0';
      local_398.data[3] = '\0';
      local_398.data[4] = '\0';
      local_398.data[5] = '\0';
      local_398.data[6] = '\0';
      local_398.data[7] = '\0';
      local_398.data[8] = '\0';
      local_398.data[9] = '\0';
      local_398.data[10] = '\0';
      local_398.data[0xb] = '\0';
      local_398.data[0xc] = '\0';
      local_398.data[0xd] = '\0';
      local_398.data[0xe] = '\0';
      local_398.data[0xf] = '\0';
      local_3d8.ndata = (undefined1 *)0x0;
      local_3d8.magic[0] = 0xda;
      local_3d8.magic[1] = 'o';
      local_3d8.magic[2] = 0xb3;
      local_3d8.magic[3] = 0x8c;
      local_3d8._4_4_ = 0;
      local_3d8.noncefp = (secp256k1_nonce_function_hardened)0x0;
      testrand256((uchar *)&local_2b8);
      testrand256(local_2f8 + 0x20);
      iVar15 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,(uchar *)&local_2b8);
      if (iVar15 == 0) break;
      iVar15 = secp256k1_keypair_xonly_pub(CTX,pubkey,(int *)0x0,(secp256k1_keypair *)local_168);
      if (iVar15 == 0) goto LAB_0013fd94;
      iVar15 = secp256k1_schnorrsig_sign_internal
                         (CTX,local_358,local_2f8,0x20,(secp256k1_keypair *)local_168,
                          nonce_function_bip340,(void *)0x0);
      if (iVar15 == 0) goto LAB_0013fd99;
      iVar15 = secp256k1_schnorrsig_verify(CTX,local_358,local_2f8,0x20,pubkey);
      if (iVar15 == 0) goto LAB_0013fd9e;
      iVar15 = secp256k1_schnorrsig_sign_internal
                         (CTX,local_288.data,local_2f8,0x20,(secp256k1_keypair *)local_168,
                          nonce_function_bip340,(void *)0x0);
      if (iVar15 == 0) goto LAB_0013fda3;
      lVar13 = 0;
      do {
        iVar15 = (uint)(byte)local_358[lVar13] - (uint)local_288.data[lVar13];
        if (local_358[lVar13] != local_288.data[lVar13]) goto LAB_0013f386;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x40);
      iVar15 = 0;
LAB_0013f386:
      if (iVar15 != 0) goto LAB_0013fda8;
      iVar15 = secp256k1_schnorrsig_sign_custom
                         (CTX,local_358,local_2f8,0x20,(secp256k1_keypair *)local_168,&local_3d8);
      if (iVar15 == 0) goto LAB_0013fdad;
      iVar15 = secp256k1_schnorrsig_verify(CTX,local_358,local_2f8,0x20,pubkey);
      if (iVar15 == 0) goto LAB_0013fdb2;
      builtin_memcpy(local_328,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                     0x10);
      local_338 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      uStack_330._0_4_ = 0x1010101;
      uStack_330._4_4_ = 0x1010101;
      local_348 = (uchar *)0x101010101010101;
      psStack_340 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_358 = (undefined1  [8])0x101010101010101;
      puStack_350 = (uchar *)0x101010101010101;
      local_3d8.noncefp = nonce_function_failing;
      iVar15 = secp256k1_schnorrsig_sign_custom
                         (CTX,local_358,local_2f8,0x20,(secp256k1_keypair *)local_168,&local_3d8);
      if (iVar15 != 0) goto LAB_0013fdb7;
      lVar13 = 0;
      do {
        iVar15 = (uint)(byte)local_358[lVar13] - (uint)local_398.data[lVar13];
        if (local_358[lVar13] != local_398.data[lVar13]) goto LAB_0013f475;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x40);
      iVar15 = 0;
LAB_0013f475:
      if (iVar15 != 0) goto LAB_0013fdbc;
      builtin_memcpy(local_328,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                     0x10);
      local_338 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      uStack_330._0_4_ = 0x1010101;
      uStack_330._4_4_ = 0x1010101;
      local_348 = (uchar *)0x101010101010101;
      psStack_340 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_358 = (undefined1  [8])0x101010101010101;
      puStack_350 = (uchar *)0x101010101010101;
      local_3d8.noncefp = nonce_function_0;
      iVar15 = secp256k1_schnorrsig_sign_custom
                         (CTX,local_358,local_2f8,0x20,(secp256k1_keypair *)local_168,&local_3d8);
      if (iVar15 != 0) goto LAB_0013fdc1;
      lVar13 = 0;
      do {
        iVar15 = (uint)(byte)local_358[lVar13] - (uint)local_398.data[lVar13];
        if (local_358[lVar13] != local_398.data[lVar13]) goto LAB_0013f507;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x40);
      iVar15 = 0;
LAB_0013f507:
      if (iVar15 != 0) goto LAB_0013fdc6;
      builtin_memcpy(local_328,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                     0x10);
      local_338 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      uStack_330._0_4_ = 0x1010101;
      uStack_330._4_4_ = 0x1010101;
      local_348 = (uchar *)0x101010101010101;
      psStack_340 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_358 = (undefined1  [8])0x101010101010101;
      puStack_350 = (uchar *)0x101010101010101;
      local_3d8.noncefp = nonce_function_overflowing;
      iVar15 = secp256k1_schnorrsig_sign_custom
                         (CTX,local_358,local_2f8,0x20,(secp256k1_keypair *)local_168,&local_3d8);
      if (iVar15 == 0) goto LAB_0013fdcb;
      iVar15 = secp256k1_schnorrsig_verify(CTX,local_358,local_2f8,0x20,pubkey);
      if (iVar15 == 0) goto LAB_0013fdd0;
      local_3d8.noncefp = (secp256k1_nonce_function_hardened)0x0;
      local_3d8.ndata = local_2f8 + 0x20;
      iVar15 = secp256k1_schnorrsig_sign_custom
                         (CTX,local_358,local_2f8,0x20,(secp256k1_keypair *)local_168,&local_3d8);
      if (iVar15 == 0) goto LAB_0013fdd5;
      iVar15 = secp256k1_schnorrsig_sign_internal
                         (CTX,local_288.data,local_2f8,0x20,(secp256k1_keypair *)local_168,
                          nonce_function_bip340,local_3d8.ndata);
      if (iVar15 == 0) goto LAB_0013fdda;
      lVar13 = 0;
      do {
        iVar15 = (uint)(byte)local_358[lVar13] - (uint)local_288.data[lVar13];
        if (local_358[lVar13] != local_288.data[lVar13]) goto LAB_0013f63d;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x40);
      iVar15 = 0;
LAB_0013f63d:
      if (iVar15 != 0) goto LAB_0013fddf;
      testrand256((uchar *)&local_2b8);
      iVar15 = secp256k1_keypair_create(CTX,&local_288,(uchar *)&local_2b8);
      if (iVar15 == 0) goto LAB_0013fde4;
      iVar15 = secp256k1_keypair_xonly_pub(CTX,&local_398,(int *)0x0,&local_288);
      if (iVar15 == 0) goto LAB_0013fde9;
      lVar13 = 0;
      do {
        puVar18 = local_358 + lVar13;
        testrand256(puVar18);
        iVar15 = secp256k1_schnorrsig_sign_internal
                           (CTX,pubkey->data,puVar18,0x20,&local_288,nonce_function_bip340,
                            (void *)0x0);
        if (iVar15 == 0) {
          run_schnorrsig_tests_cold_69();
LAB_0013fd76:
          run_schnorrsig_tests_cold_68();
LAB_0013fd7b:
          run_schnorrsig_tests_cold_100();
LAB_0013fd80:
          run_schnorrsig_tests_cold_99();
LAB_0013fd85:
          run_schnorrsig_tests_cold_98();
LAB_0013fd8a:
          run_schnorrsig_tests_cold_97();
          goto LAB_0013fd8f;
        }
        iVar15 = secp256k1_schnorrsig_verify(CTX,pubkey->data,puVar18,0x20,&local_398);
        if (iVar15 == 0) goto LAB_0013fd76;
        lVar13 = lVar13 + 0x20;
        pubkey = pubkey + 1;
      } while (lVar13 != 0x60);
      uVar8 = testrand_int(3);
      uVar19 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar16 = secp256k1_test_state[1] << 0x11;
      uVar17 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar14 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar17;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar14;
      secp256k1_test_state[2] = uVar17 ^ uVar16;
      secp256k1_test_state[3] = uVar14 << 0x2d | uVar14 >> 0x13;
      uVar19 = uVar19 >> 0x3b;
      uVar10 = testrand_int(0xfe);
      sig64 = local_228 + (ulong)uVar8 * 0x40;
      bVar20 = (char)uVar10 + 1;
      sig64[uVar19] = sig64[uVar19] ^ bVar20;
      puVar18 = local_358 + (ulong)uVar8 * 0x20;
      iVar15 = secp256k1_schnorrsig_verify(CTX,sig64,puVar18,0x20,&local_398);
      if (iVar15 != 0) goto LAB_0013fdee;
      sig64[uVar19] = sig64[uVar19] ^ bVar20;
      uVar19 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar16 = secp256k1_test_state[1] << 0x11;
      uVar17 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar14 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar17;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar14;
      secp256k1_test_state[2] = uVar17 ^ uVar16;
      secp256k1_test_state[3] = uVar14 << 0x2d | uVar14 >> 0x13;
      uVar19 = uVar19 >> 0x3b;
      sig64[uVar19 + 0x20] = sig64[uVar19 + 0x20] ^ bVar20;
      iVar15 = secp256k1_schnorrsig_verify(CTX,sig64,puVar18,0x20,&local_398);
      if (iVar15 != 0) goto LAB_0013fdf3;
      sig64[uVar19 + 0x20] = sig64[uVar19 + 0x20] ^ bVar20;
      uVar19 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar16 = secp256k1_test_state[1] << 0x11;
      uVar17 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar14 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar17;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar14;
      secp256k1_test_state[2] = uVar17 ^ uVar16;
      secp256k1_test_state[3] = uVar14 << 0x2d | uVar14 >> 0x13;
      uVar19 = uVar19 >> 0x3b;
      puVar18[uVar19] = puVar18[uVar19] ^ bVar20;
      iVar15 = secp256k1_schnorrsig_verify(CTX,sig64,puVar18,0x20,&local_398);
      if (iVar15 != 0) goto LAB_0013fdf8;
      puVar18[uVar19] = puVar18[uVar19] ^ bVar20;
      iVar15 = secp256k1_schnorrsig_verify(CTX,sig64,puVar18,0x20,&local_398);
      if (iVar15 == 0) goto LAB_0013fdfd;
      iVar15 = secp256k1_schnorrsig_sign_internal
                         (CTX,local_228,local_358,0x20,&local_288,nonce_function_bip340,(void *)0x0)
      ;
      if (iVar15 == 0) goto LAB_0013fe02;
      iVar15 = secp256k1_schnorrsig_verify(CTX,local_228,local_358,0x20,&local_398);
      if (iVar15 == 0) goto LAB_0013fe07;
      local_228[0x30] = 0xff;
      local_228[0x31] = 0xff;
      local_228[0x32] = 0xff;
      local_228[0x33] = 0xff;
      local_228[0x34] = 0xff;
      local_228[0x35] = 0xff;
      local_228[0x36] = 0xff;
      local_228[0x37] = 0xff;
      local_228[0x38] = 0xff;
      local_228[0x39] = 0xff;
      local_228[0x3a] = 0xff;
      local_228[0x3b] = 0xff;
      local_228[0x3c] = 0xff;
      local_228[0x3d] = 0xff;
      local_228[0x3e] = 0xff;
      local_228[0x3f] = 0xff;
      local_228._32_8_ = 0xffffffffffffffff;
      local_228[0x28] = 0xff;
      local_228[0x29] = 0xff;
      local_228[0x2a] = 0xff;
      local_228[0x2b] = 0xff;
      local_228[0x2c] = 0xff;
      local_228[0x2d] = 0xff;
      local_228[0x2e] = 0xff;
      local_228[0x2f] = 0xff;
      iVar15 = secp256k1_schnorrsig_verify(CTX,local_228,local_358,0x20,&local_398);
      if (iVar15 != 0) goto LAB_0013fe0c;
      iVar15 = secp256k1_schnorrsig_sign_internal
                         (CTX,local_228,local_358,0x20,&local_288,nonce_function_bip340,(void *)0x0)
      ;
      if (iVar15 == 0) goto LAB_0013fe11;
      iVar15 = secp256k1_schnorrsig_verify(CTX,local_228,local_358,0x20,&local_398);
      if (iVar15 == 0) goto LAB_0013fe16;
      secp256k1_scalar_set_b32((secp256k1_scalar *)local_2f8,local_228 + 0x20,(int *)0x0);
      secp256k1_scalar_negate((secp256k1_scalar *)local_2f8,(secp256k1_scalar *)local_2f8);
      secp256k1_scalar_get_b32(local_228 + 0x20,(secp256k1_scalar *)local_2f8);
      iVar15 = secp256k1_schnorrsig_verify(CTX,local_228,local_358,0x20,&local_398);
      if (iVar15 != 0) goto LAB_0013fe1b;
      iVar15 = secp256k1_schnorrsig_sign_custom
                         (CTX,local_228,(uchar *)0x0,0,&local_288,
                          (secp256k1_schnorrsig_extraparams *)0x0);
      if (iVar15 == 0) goto LAB_0013fe20;
      iVar15 = secp256k1_schnorrsig_verify(CTX,local_228,(uchar *)0x0,0,&local_398);
      if (iVar15 == 0) goto LAB_0013fe25;
      uVar8 = testrand_int(0x100);
      uVar14 = 0xffffffffffffffe0;
      do {
        testrand256(local_168 + uVar14 + 0x20);
        uVar14 = uVar14 + 0x20;
      } while (uVar14 < 0xe0);
      iVar15 = secp256k1_schnorrsig_sign_custom
                         (CTX,local_228,local_168,(ulong)uVar8,&local_288,
                          (secp256k1_schnorrsig_extraparams *)0x0);
      if (iVar15 == 0) goto LAB_0013fe2a;
      iVar15 = secp256k1_schnorrsig_verify(CTX,local_228,local_168,(ulong)uVar8,&local_398);
      if (iVar15 == 0) goto LAB_0013fe2f;
      iVar15 = secp256k1_schnorrsig_verify
                         (CTX,local_228,local_168,(ulong)(uVar8 - 1 & 0xff),&local_398);
      if (iVar15 != 0) goto LAB_0013fe34;
      uVar11 = local_2b8.magnitude + 1;
      local_2b8._40_8_ = ZEXT48(uVar11);
      if (COUNT <= (int)uVar11) goto LAB_0013fb65;
    }
LAB_0013fd8f:
    run_schnorrsig_tests_cold_82();
LAB_0013fd94:
    run_schnorrsig_tests_cold_81();
LAB_0013fd99:
    run_schnorrsig_tests_cold_80();
LAB_0013fd9e:
    run_schnorrsig_tests_cold_79();
LAB_0013fda3:
    run_schnorrsig_tests_cold_78();
LAB_0013fda8:
    run_schnorrsig_tests_cold_35();
LAB_0013fdad:
    run_schnorrsig_tests_cold_77();
LAB_0013fdb2:
    run_schnorrsig_tests_cold_76();
LAB_0013fdb7:
    run_schnorrsig_tests_cold_36();
LAB_0013fdbc:
    run_schnorrsig_tests_cold_37();
LAB_0013fdc1:
    run_schnorrsig_tests_cold_38();
LAB_0013fdc6:
    run_schnorrsig_tests_cold_39();
LAB_0013fdcb:
    run_schnorrsig_tests_cold_75();
LAB_0013fdd0:
    run_schnorrsig_tests_cold_74();
LAB_0013fdd5:
    run_schnorrsig_tests_cold_73();
LAB_0013fdda:
    run_schnorrsig_tests_cold_72();
LAB_0013fddf:
    run_schnorrsig_tests_cold_40();
LAB_0013fde4:
    run_schnorrsig_tests_cold_71();
LAB_0013fde9:
    run_schnorrsig_tests_cold_70();
LAB_0013fdee:
    run_schnorrsig_tests_cold_41();
LAB_0013fdf3:
    run_schnorrsig_tests_cold_42();
LAB_0013fdf8:
    run_schnorrsig_tests_cold_43();
LAB_0013fdfd:
    run_schnorrsig_tests_cold_67();
LAB_0013fe02:
    run_schnorrsig_tests_cold_66();
LAB_0013fe07:
    run_schnorrsig_tests_cold_65();
LAB_0013fe0c:
    run_schnorrsig_tests_cold_44();
LAB_0013fe11:
    run_schnorrsig_tests_cold_64();
LAB_0013fe16:
    run_schnorrsig_tests_cold_63();
LAB_0013fe1b:
    run_schnorrsig_tests_cold_45();
LAB_0013fe20:
    run_schnorrsig_tests_cold_62();
LAB_0013fe25:
    run_schnorrsig_tests_cold_61();
LAB_0013fe2a:
    run_schnorrsig_tests_cold_60();
LAB_0013fe2f:
    run_schnorrsig_tests_cold_59();
LAB_0013fe34:
    run_schnorrsig_tests_cold_46();
LAB_0013fe39:
    run_schnorrsig_tests_cold_102();
LAB_0013fe3e:
    run_schnorrsig_tests_cold_101();
LAB_0013fe43:
    run_schnorrsig_tests_cold_96();
LAB_0013fe48:
    run_schnorrsig_tests_cold_95();
LAB_0013fe4d:
    run_schnorrsig_tests_cold_1();
LAB_0013fe52:
    run_schnorrsig_tests_cold_94();
LAB_0013fe57:
    run_schnorrsig_tests_cold_93();
LAB_0013fe5c:
    run_schnorrsig_tests_cold_92();
LAB_0013fe61:
    run_schnorrsig_tests_cold_91();
LAB_0013fe66:
    run_schnorrsig_tests_cold_90();
LAB_0013fe6b:
    run_schnorrsig_tests_cold_89();
LAB_0013fe70:
    run_schnorrsig_tests_cold_88();
    psVar12 = extraout_RAX;
LAB_0013fe75:
    (*(psVar12->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar12->illegal_callback).data);
  } while( true );
LAB_0013fb65:
  testrand256(local_398.data);
  a_00 = (secp256k1_fe *)local_168;
  a_01 = CTX;
  iVar15 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)a_00,local_398.data);
  if (iVar15 == 0) {
LAB_001400aa:
    run_schnorrsig_tests_cold_58();
LAB_001400af:
    run_schnorrsig_tests_cold_57();
LAB_001400b4:
    run_schnorrsig_tests_cold_56();
LAB_001400b9:
    run_schnorrsig_tests_cold_47();
LAB_001400be:
    run_schnorrsig_tests_cold_55();
LAB_001400c3:
    run_schnorrsig_tests_cold_54();
LAB_001400c8:
    run_schnorrsig_tests_cold_53();
LAB_001400cd:
    run_schnorrsig_tests_cold_52();
LAB_001400d2:
    run_schnorrsig_tests_cold_51();
LAB_001400d7:
    run_schnorrsig_tests_cold_50();
  }
  else {
    a_00 = (secp256k1_fe *)local_228;
    a_01 = CTX;
    iVar15 = secp256k1_keypair_xonly_pub
                       (CTX,(secp256k1_xonly_pubkey *)a_00,(int *)0x0,(secp256k1_keypair *)local_168
                       );
    if (iVar15 == 0) goto LAB_001400af;
    a_00 = (secp256k1_fe *)(local_2f8 + 0x20);
    a_01 = CTX;
    iVar15 = secp256k1_xonly_pubkey_serialize(CTX,(uchar *)a_00,(secp256k1_xonly_pubkey *)local_228)
    ;
    if (iVar15 == 0) goto LAB_001400b4;
    a_00 = (secp256k1_fe *)local_168;
    a_01 = CTX;
    iVar15 = secp256k1_keypair_xonly_tweak_add(CTX,(secp256k1_keypair *)a_00,local_2f8 + 0x20);
    if (iVar15 != 1) goto LAB_001400b9;
    a_00 = (secp256k1_fe *)local_358;
    a_01 = CTX;
    iVar15 = secp256k1_keypair_xonly_pub
                       (CTX,(secp256k1_xonly_pubkey *)a_00,(int *)&local_3b8,
                        (secp256k1_keypair *)local_168);
    if (iVar15 == 0) goto LAB_001400be;
    a_00 = (secp256k1_fe *)local_2f8;
    a_01 = CTX;
    iVar15 = secp256k1_xonly_pubkey_serialize(CTX,(uchar *)a_00,(secp256k1_xonly_pubkey *)local_358)
    ;
    if (iVar15 == 0) goto LAB_001400c3;
    testrand256(local_3d8.magic);
    a_00 = (secp256k1_fe *)&local_288;
    a_01 = CTX;
    iVar15 = secp256k1_schnorrsig_sign_internal
                       (CTX,(uchar *)a_00,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                        nonce_function_bip340,(void *)0x0);
    if (iVar15 == 0) goto LAB_001400c8;
    a_00 = (secp256k1_fe *)local_358;
    a_01 = CTX;
    iVar15 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)a_00,local_2f8);
    if (iVar15 == 0) goto LAB_001400cd;
    a_00 = (secp256k1_fe *)&local_288;
    a_01 = CTX;
    iVar15 = secp256k1_schnorrsig_verify
                       (CTX,(uchar *)a_00,local_3d8.magic,0x20,(secp256k1_xonly_pubkey *)local_358);
    if (iVar15 == 0) goto LAB_001400d2;
    a_00 = &local_2b8;
    a_01 = CTX;
    iVar15 = secp256k1_xonly_pubkey_serialize(CTX,(uchar *)a_00,(secp256k1_xonly_pubkey *)local_228)
    ;
    if (iVar15 == 0) goto LAB_001400d7;
    a_00 = (secp256k1_fe *)local_228;
    a_01 = CTX;
    iVar15 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)a_00,(uchar *)&local_2b8);
    if (iVar15 != 0) {
      a_00 = (secp256k1_fe *)local_2f8;
      a_01 = CTX;
      iVar15 = secp256k1_xonly_pubkey_tweak_add_check
                         (CTX,(uchar *)a_00,(int)local_3b8.magic,(secp256k1_xonly_pubkey *)local_228
                          ,local_2f8 + 0x20);
      if (iVar15 != 0) {
        return;
      }
      goto LAB_001400e1;
    }
  }
  run_schnorrsig_tests_cold_49();
LAB_001400e1:
  run_schnorrsig_tests_cold_48();
  secp256k1_fe_verify(a_00);
  secp256k1_fe_verify(a);
  *(undefined4 *)((a_01->ecmult_gen_ctx).ge_offset.y.n + 1) = 0;
  uVar1 = a_00->n[1];
  uVar2 = a_00->n[2];
  uVar3 = a_00->n[3];
  uVar4 = a_00->n[4];
  uVar5 = *(uint64_t *)&a_00->magnitude;
  *(uint64_t *)&a_01->ecmult_gen_ctx = a_00->n[0];
  (a_01->ecmult_gen_ctx).scalar_offset.d[0] = uVar1;
  (a_01->ecmult_gen_ctx).scalar_offset.d[1] = uVar2;
  (a_01->ecmult_gen_ctx).scalar_offset.d[2] = uVar3;
  (a_01->ecmult_gen_ctx).scalar_offset.d[3] = uVar4;
  (a_01->ecmult_gen_ctx).ge_offset.x.n[0] = uVar5;
  uVar1 = a->n[1];
  uVar2 = a->n[2];
  uVar3 = a->n[3];
  uVar6 = *(undefined4 *)(a->n + 4);
  uVar7 = *(undefined4 *)((long)(a->n + 4) + 4);
  uVar4 = *(uint64_t *)&a->magnitude;
  (a_01->ecmult_gen_ctx).ge_offset.x.n[1] = a->n[0];
  (a_01->ecmult_gen_ctx).ge_offset.x.n[2] = uVar1;
  (a_01->ecmult_gen_ctx).ge_offset.x.n[3] = uVar2;
  (a_01->ecmult_gen_ctx).ge_offset.x.n[4] = uVar3;
  (a_01->ecmult_gen_ctx).ge_offset.x.magnitude = uVar6;
  (a_01->ecmult_gen_ctx).ge_offset.x.normalized = uVar7;
  (a_01->ecmult_gen_ctx).ge_offset.y.n[0] = uVar4;
  secp256k1_ge_verify((secp256k1_ge *)a_01);
  return;
}

Assistant:

static void run_schnorrsig_tests(void) {
    int i;
    run_nonce_function_bip340_tests();

    test_schnorrsig_api();
    test_schnorrsig_sha256_tagged();
    test_schnorrsig_bip_vectors();
    for (i = 0; i < COUNT; i++) {
        test_schnorrsig_sign();
        test_schnorrsig_sign_verify();
    }
    test_schnorrsig_taproot();
}